

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O1

bool __thiscall
Rml::DecoratorTiledBox::Initialise(DecoratorTiledBox *this,Tile *_tiles,Texture *_textures)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  long lVar9;
  TextureFileIndex *pTVar10;
  bool bVar11;
  byte bVar12;
  Texture texture;
  
  bVar12 = 0;
  pTVar10 = &_textures->file_index;
  lVar9 = 0x30;
  do {
    puVar7 = (undefined4 *)((long)(&_tiles->tile_data + -3) + lVar9);
    puVar8 = (undefined4 *)
             ((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar9);
    for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    }
    texture._8_8_ = *(undefined8 *)pTVar10;
    texture.render_manager = ((Texture *)(pTVar10 + -2))->render_manager;
    iVar3 = Decorator::AddTexture((Decorator *)this,texture);
    *(int *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar9) = iVar3;
    pTVar10 = pTVar10 + 4;
    lVar9 = lVar9 + 0x4c;
  } while (lVar9 != 0x2dc);
  if (*(int *)&this->field_0x30 == -1) {
    bVar11 = true;
  }
  else {
    piVar4 = (int *)&this->field_0x7c;
    uVar2 = 0;
    do {
      uVar6 = uVar2;
      if (uVar6 == 3) break;
      iVar3 = *piVar4;
      piVar4 = piVar4 + 0x13;
      uVar2 = uVar6 + 1;
    } while (iVar3 != -1);
    bVar11 = uVar6 < 3;
  }
  if (bVar11) {
    return false;
  }
  if (*(int *)&this->field_0x290 < 0) {
    return false;
  }
  uVar1 = *(uint *)&this->field_0x160;
  if ((uVar1 == 0xffffffff) && (-1 < *(int *)&this->field_0x1ac)) {
    puVar7 = (undefined4 *)&this->field_0x1ac;
    puVar8 = (undefined4 *)&this->field_0x160;
    for (lVar9 = 0x13; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    }
    *(undefined4 *)&this->field_0x194 = 1;
LAB_0021391d:
    uVar1 = *(uint *)&this->field_0x1f8;
    if ((uVar1 == 0xffffffff) && (-1 < *(int *)&this->field_0x244)) {
      puVar7 = (undefined4 *)&this->field_0x244;
      puVar8 = (undefined4 *)&this->field_0x1f8;
      for (lVar9 = 0x13; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      }
      *(undefined4 *)&this->field_0x22c = 2;
    }
    else if ((int)uVar1 < 0 || *(uint *)&this->field_0x244 != 0xffffffff) {
      if ((*(uint *)&this->field_0x244 & uVar1) == 0xffffffff) goto LAB_00213967;
    }
    else {
      puVar7 = (undefined4 *)&this->field_0x1f8;
      puVar8 = (undefined4 *)&this->field_0x244;
      for (lVar9 = 0x13; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      }
      *(undefined4 *)&this->field_0x278 = 2;
    }
    bVar11 = true;
  }
  else {
    if (-1 < (int)uVar1 && *(uint *)&this->field_0x1ac == 0xffffffff) {
      puVar7 = (undefined4 *)&this->field_0x160;
      puVar8 = (undefined4 *)&this->field_0x1ac;
      for (lVar9 = 0x13; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      }
      *(undefined4 *)&this->field_0x1e0 = 1;
      goto LAB_0021391d;
    }
    if ((*(uint *)&this->field_0x1ac & uVar1) != 0xffffffff) goto LAB_0021391d;
LAB_00213967:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool DecoratorTiledBox::Initialise(const Tile* _tiles, const Texture* _textures)
{
	// Load the textures.
	for (int i = 0; i < 9; i++)
	{
		tiles[i] = _tiles[i];
		tiles[i].texture_index = AddTexture(_textures[i]);
	}

	// All corners must have a valid texture.
	for (int i = TOP_LEFT_CORNER; i <= BOTTOM_RIGHT_CORNER; i++)
	{
		if (tiles[i].texture_index == -1)
			return false;
	}
	// Check that the centre tile has been specified.
	if (tiles[CENTRE].texture_index < 0)
		return false;

	// If only one side of the left / right edges have been configured, then mirror the tile for the other side.
	if (tiles[LEFT_EDGE].texture_index == -1 && tiles[RIGHT_EDGE].texture_index > -1)
	{
		tiles[LEFT_EDGE] = tiles[RIGHT_EDGE];
		tiles[LEFT_EDGE].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[RIGHT_EDGE].texture_index == -1 && tiles[LEFT_EDGE].texture_index > -1)
	{
		tiles[RIGHT_EDGE] = tiles[LEFT_EDGE];
		tiles[RIGHT_EDGE].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[LEFT_EDGE].texture_index == -1 && tiles[RIGHT_EDGE].texture_index == -1)
		return false;

	// If only one side of the top / bottom edges have been configured, then mirror the tile for the other side.
	if (tiles[TOP_EDGE].texture_index == -1 && tiles[BOTTOM_EDGE].texture_index > -1)
	{
		tiles[TOP_EDGE] = tiles[BOTTOM_EDGE];
		tiles[TOP_EDGE].orientation = FLIP_VERTICAL;
	}
	else if (tiles[BOTTOM_EDGE].texture_index == -1 && tiles[TOP_EDGE].texture_index > -1)
	{
		tiles[BOTTOM_EDGE] = tiles[TOP_EDGE];
		tiles[BOTTOM_EDGE].orientation = FLIP_VERTICAL;
	}
	else if (tiles[TOP_EDGE].texture_index == -1 && tiles[BOTTOM_EDGE].texture_index == -1)
		return false;

	return true;
}